

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

int cpu_memory_rw_debug_riscv64
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  AddressSpace *as;
  undefined4 in_EAX;
  uint uVar2;
  hwaddr hVar3;
  undefined7 in_register_00000081;
  ulong uVar4;
  MemTxAttrs attrs;
  undefined4 local_34;
  
  _attrs = CONCAT44((int)CONCAT71(in_register_00000081,is_write),in_EAX);
  while( true ) {
    if (len == 0) {
      return 0;
    }
    uVar4 = addr & 0xfffffffffffff000;
    p_Var1 = cpu->cc->get_phys_page_attrs_debug;
    if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
      _attrs = CONCAT44(local_34,1);
      hVar3 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,uVar4);
    }
    else {
      hVar3 = (*p_Var1)((CPUState_conflict *)cpu,uVar4,&attrs);
    }
    uVar2 = cpu_asidx_from_attrs(cpu,attrs);
    if (hVar3 == 0xffffffffffffffff) break;
    uVar4 = (uVar4 - addr) + 0x1000;
    if (len <= uVar4) {
      uVar4 = len;
    }
    hVar3 = hVar3 + ((uint)addr & 0xfff);
    as = cpu->cpu_ases[uVar2].as;
    if ((char)local_34 == '\0') {
      address_space_read_full_riscv64(as,hVar3,attrs,ptr,uVar4);
    }
    else {
      address_space_write_rom_riscv64(as,hVar3,attrs,ptr,uVar4);
    }
    len = len - uVar4;
    ptr = (void *)((long)ptr + uVar4);
    addr = addr + uVar4;
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}